

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true,_false,_false>::
visit<slang::ast::NamedValueExpression>
          (ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true,_false,_false> *this,
          NamedValueExpression *t)

{
  bool bVar1;
  Expression *in_RSI;
  ValueExpressionBase *in_stack_00000018;
  MonitorVisitor *in_stack_00000020;
  
  bVar1 = Expression::bad(in_RSI);
  if (!bVar1) {
    ast::builtins::MonitorVisitor::handle(in_stack_00000020,in_stack_00000018);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }